

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O3

void yaml_parser_set_input_string(yaml_parser_t *parser,uchar *input,size_t size)

{
  if (parser == (yaml_parser_t *)0x0) {
    __assert_fail("parser",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x124,
                  "void yaml_parser_set_input_string(yaml_parser_t *, const unsigned char *, size_t)"
                 );
  }
  if (parser->read_handler == (yaml_read_handler_t *)0x0) {
    if (input != (uchar *)0x0) {
      parser->read_handler = yaml_string_read_handler;
      parser->read_handler_data = parser;
      (parser->input).string.start = input;
      (parser->input).string.current = input;
      (parser->input).string.end = input + size;
      return;
    }
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x126,
                  "void yaml_parser_set_input_string(yaml_parser_t *, const unsigned char *, size_t)"
                 );
  }
  __assert_fail("!parser->read_handler",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                ,0x125,
                "void yaml_parser_set_input_string(yaml_parser_t *, const unsigned char *, size_t)")
  ;
}

Assistant:

YAML_DECLARE(void)
yaml_parser_set_input_string(yaml_parser_t *parser,
        const unsigned char *input, size_t size)
{
    assert(parser); /* Non-NULL parser object expected. */
    assert(!parser->read_handler);  /* You can set the source only once. */
    assert(input);  /* Non-NULL input string expected. */

    parser->read_handler = yaml_string_read_handler;
    parser->read_handler_data = parser;

    parser->input.string.start = input;
    parser->input.string.current = input;
    parser->input.string.end = input+size;
}